

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

int sfd_tran_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  uint16_t uVar1;
  int iVar2;
  nni_sock *sock;
  
  sock = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x2c8) = nlistener;
  nni_mtx_init((nni_mtx *)arg);
  nni_list_init_offset((nni_list *)((long)arg + 0x298),0x28);
  nni_list_init_offset((nni_list *)((long)arg + 0x2b0),0x28);
  nni_aio_init((nni_aio *)((long)arg + 0xd0),sfd_tran_accept_cb,arg);
  uVar1 = nni_sock_proto_id(sock);
  *(uint16_t *)((long)arg + 0x28) = uVar1;
  nni_stat_init((nni_stat_item *)((long)arg + 0x2d8),&sfd_tran_listener_init::rcv_max_info);
  iVar2 = 0xf;
  if ((((url->u_hostname == (char *)0x0) && (*url->u_path == '\0')) &&
      (url->u_fragment == (char *)0x0)) &&
     ((url->u_userinfo == (char *)0x0 && (url->u_query == (char *)0x0)))) {
    iVar2 = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x2d0),url);
    if (iVar2 == 0) {
      nni_listener_add_stat(nlistener,(nni_stat_item *)((long)arg + 0x2d8));
      iVar2 = 0;
    }
    else {
      sfd_tran_ep_fini(arg);
    }
  }
  return iVar2;
}

Assistant:

static int
sfd_tran_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	sfd_tran_ep *ep = arg;
	int          rv;
	nni_sock    *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	nni_mtx_init(&ep->mtx);
	NNI_LIST_INIT(&ep->waitpipes, sfd_tran_pipe, node);
	NNI_LIST_INIT(&ep->negopipes, sfd_tran_pipe, node);
	nni_aio_init(&ep->connaio, sfd_tran_accept_cb, ep);

	ep->proto = nni_sock_proto_id(sock);

#ifdef NNG_ENABLE_STATS
	static const nni_stat_info rcv_max_info = {
		.si_name   = "rcv_max",
		.si_desc   = "maximum receive size",
		.si_type   = NNG_STAT_LEVEL,
		.si_unit   = NNG_UNIT_BYTES,
		.si_atomic = true,
	};
	nni_stat_init(&ep->st_rcv_max, &rcv_max_info);
#endif

	// Check for invalid URL components -- we only accept a bare scheme
	if ((url->u_hostname != NULL) || (strlen(url->u_path) != 0) ||
	    (url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		sfd_tran_ep_fini(ep);
		return (rv);
	}

#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(nlistener, &ep->st_rcv_max);
#endif

	return (0);
}